

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::applyDiagnosticPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  Token *this_00;
  size_type sVar1;
  int iVar2;
  SyntaxNode *pSVar3;
  SimplePragmaExpressionSyntax *pSVar4;
  SourceLocation SVar5;
  NameValuePragmaExpressionSyntax *pNVar6;
  Diagnostic *this_01;
  ParenPragmaExpressionSyntax *pPVar7;
  PragmaExpressionSyntax *expr;
  char *pcVar8;
  size_t sVar10;
  ulong uVar11;
  size_type __rlen;
  SourceManager *this_02;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *this_03;
  size_t index;
  ulong uVar12;
  size_t index_00;
  string_view sVar13;
  SourceRange SVar14;
  DiagnosticSeverity severity;
  Token last;
  undefined1 local_54 [20];
  Token local_40;
  int *piVar9;
  
  sVar1 = (pragma->args).elements.size_;
  if (sVar1 == 0) {
    local_40 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar5 = Token::location(&local_40);
    sVar13 = Token::rawText(&local_40);
    addDiag(this,(DiagCode)0x1d0004,(SourceLocation)((long)SVar5 + sVar13._M_len * 0x10000000));
  }
  else {
    uVar12 = sVar1 + 1;
    if (1 < uVar12) {
      this_03 = &pragma->args;
      index_00 = 0;
      local_54._4_8_ = this;
      local_54._12_8_ = this_03;
      do {
        pSVar3 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  operator[](this_03,index_00)->super_SyntaxNode;
        if (pSVar3->kind == NameValuePragmaExpression) {
          pNVar6 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                             (pSVar3);
          sVar13 = Token::valueText(&pNVar6->name);
          piVar9 = (int *)sVar13._M_str;
          sVar10 = sVar13._M_len;
          if (sVar10 == 4) {
            iVar2 = bcmp(piVar9,"warn",4);
            if (iVar2 != 0) {
LAB_001a10e4:
              SVar14 = Token::range(&pNVar6->name);
              addDiag(this,(DiagCode)0x1e0004,SVar14);
              this_03 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)
                        local_54._12_8_;
              goto LAB_001a1210;
            }
            local_54._0_4_ = 2;
          }
          else if (sVar10 == 5) {
            iVar2 = bcmp(piVar9,"error",5);
            if (iVar2 == 0) {
              local_54._0_4_ = 3;
            }
            else {
              if ((char)piVar9[1] != 'l' || *piVar9 != 0x61746166) goto LAB_001a10e4;
              local_54._0_4_ = 4;
            }
          }
          else {
            if ((sVar10 != 6) || ((short)piVar9[1] != 0x6572 || *piVar9 != 0x6f6e6769))
            goto LAB_001a10e4;
            local_54._0_4_ = 0;
          }
          local_40.info = (Info *)local_54;
          local_40._0_8_ = this;
          pSVar3 = &((pNVar6->value).ptr)->super_SyntaxNode;
          if (pSVar3 == (SyntaxNode *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<slang::syntax::PragmaExpressionSyntax *>::get() const [T = slang::syntax::PragmaExpressionSyntax *]"
                      );
          }
          if (pSVar3->kind == ParenPragmaExpression) {
            pPVar7 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                               (pSVar3);
            uVar11 = (pPVar7->values).elements.size_ + 1;
            this = (Preprocessor *)local_54._4_8_;
            this_03 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_54._12_8_;
            if (1 < uVar11) {
              index = 0;
              do {
                expr = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                       operator[](&pPVar7->values,index);
                applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                          ((anon_class_16_2_8b023938 *)&local_40,expr);
                index = index + 1;
                this = (Preprocessor *)local_54._4_8_;
                this_03 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)
                          local_54._12_8_;
              } while (uVar11 >> 1 != index);
            }
          }
          else {
            applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                      ((anon_class_16_2_8b023938 *)&local_40,(PragmaExpressionSyntax *)pSVar3);
            this = (Preprocessor *)local_54._4_8_;
            this_03 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_54._12_8_;
          }
        }
        else if (pSVar3->kind == SimplePragmaExpression) {
          pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                             (pSVar3);
          this_00 = &pSVar4->value;
          sVar13 = Token::rawText(this_00);
          this = (Preprocessor *)local_54._4_8_;
          piVar9 = (int *)sVar13._M_str;
          if ((pSVar4->value).kind == Identifier) {
            if (sVar13._M_len == 3) {
              if (*(char *)((long)piVar9 + 2) != 'p' || (short)*piVar9 != 0x6f70) goto LAB_001a1120;
              this_02 = *(SourceManager **)local_54._4_8_;
              SVar5 = Token::location(this_00);
              sVar10 = 7;
              pcVar8 = "__pop__";
            }
            else {
              if ((sVar13._M_len != 4) || (*piVar9 != 0x68737570)) goto LAB_001a1120;
              this_02 = *(SourceManager **)local_54._4_8_;
              SVar5 = Token::location(this_00);
              sVar10 = 8;
              pcVar8 = "__push__";
            }
            this = (Preprocessor *)local_54._4_8_;
            sVar13._M_str = pcVar8;
            sVar13._M_len = sVar10;
            SourceManager::addDiagnosticDirective(this_02,SVar5,sVar13,Ignored);
            this_03 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_54._12_8_;
          }
          else {
LAB_001a1120:
            SVar14 = Token::range(this_00);
            this_01 = addDiag(this,(DiagCode)0x2a0004,SVar14);
            Diagnostic::operator<<(this_01,sVar13);
            this_03 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_54._12_8_;
          }
        }
        else {
          SVar14 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
          addDiag(this,(DiagCode)0x1d0004,SVar14);
        }
LAB_001a1210:
        index_00 = index_00 + 1;
      } while (index_00 != uVar12 >> 1);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyDiagnosticPragma(const PragmaDirectiveSyntax& pragma) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedDiagPragmaArg, last.location() + last.rawText().length());
        return;
    }

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            string_view action = simple.value.rawText();
            if (simple.value.kind == TokenKind::Identifier && action == "push") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__push__",
                                                     DiagnosticSeverity::Ignored);
            }
            else if (simple.value.kind == TokenKind::Identifier && action == "pop") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__pop__",
                                                     DiagnosticSeverity::Ignored);
            }
            else {
                addDiag(diag::UnknownDiagPragmaArg, simple.value.range()) << action;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();

            DiagnosticSeverity severity;
            string_view text = nvp.name.valueText();
            if (text == "ignore")
                severity = DiagnosticSeverity::Ignored;
            else if (text == "warn")
                severity = DiagnosticSeverity::Warning;
            else if (text == "error")
                severity = DiagnosticSeverity::Error;
            else if (text == "fatal")
                severity = DiagnosticSeverity::Fatal;
            else {
                addDiag(diag::ExpectedDiagPragmaLevel, nvp.name.range());
                continue;
            }

            auto setDirective = [&](const PragmaExpressionSyntax& expr) {
                if (expr.kind == SyntaxKind::SimplePragmaExpression) {
                    auto& simple = expr.as<SimplePragmaExpressionSyntax>();
                    if (simple.value.kind == TokenKind::StringLiteral) {
                        sourceManager.addDiagnosticDirective(simple.value.location(),
                                                             simple.value.valueText(), severity);
                    }
                    else {
                        addDiag(diag::ExpectedDiagPragmaArg, simple.value.range());
                    }
                }
                else {
                    addDiag(diag::ExpectedDiagPragmaArg, expr.sourceRange());
                }
            };

            if (nvp.value->kind == SyntaxKind::ParenPragmaExpression) {
                auto& paren = nvp.value->as<ParenPragmaExpressionSyntax>();
                for (auto value : paren.values)
                    setDirective(*value);
            }
            else {
                setDirective(*nvp.value);
            }
        }
        else {
            addDiag(diag::ExpectedDiagPragmaArg, arg->sourceRange());
        }
    }
}